

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_primaryinstancewidget.cpp
# Opt level: O2

void PrimaryInstanceWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  addMessage((PrimaryInstanceWidget *)_o,(QByteArray *)_a[1]);
  return;
}

Assistant:

void PrimaryInstanceWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PrimaryInstanceWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->addMessage((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        default: ;
        }
    }
}